

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SudokuGitter.cpp
# Opt level: O3

void __thiscall SudokuGitter::SudokuGitter(SudokuGitter *this,uint elements)

{
  ostream *poVar1;
  ulong __n;
  allocator_type local_32;
  allocator_type local_31;
  vector<cell,_std::allocator<cell>_> local_30;
  
  __n = (ulong)elements;
  std::vector<cell,_std::allocator<cell>_>::vector(&local_30,__n,&local_31);
  std::
  vector<std::vector<cell,_std::allocator<cell>_>,_std::allocator<std::vector<cell,_std::allocator<cell>_>_>_>
  ::vector(&this->cells,__n,&local_30,&local_32);
  if (local_30.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_30.super__Vector_base<cell,_std::allocator<cell>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  this->elements = elements;
  this->quadWidth = (uint)((ulong)elements / ((long)SQRT((double)__n) & 0xffffffffU));
  this->quadHeight = (uint)(long)SQRT((double)__n);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"Create sudoku with: ",0x14);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," elements.",10);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"quad height: ",0xd);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," quad width:",0xc);
  poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

SudokuGitter::SudokuGitter(const unsigned int elements) : elements(elements),
                                                          cells(elements, vector<cell>(elements)),
                                                          quadHeight(static_cast<const unsigned int>(std::sqrt(
                                                                  elements))),
                                                          quadWidth(
                                                                  elements / static_cast<const unsigned int>(std::sqrt(
                                                                          elements))) {
    cout << "Create sudoku with: " << elements << " elements." << endl;
    cout << "quad height: " << getQuadHeight() << " quad width:" << getQuadWidth() << endl;
}